

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O1

void __thiscall
HighsImplications::cleanupVub
          (HighsImplications *this,HighsInt col,HighsInt vubCol,VarBound *vub,double ub,
          bool *redundant,bool *infeasible,bool allowBoundChanges)

{
  double dVar1;
  HighsMipSolverData *pHVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  HighsDomainChange boundchg;
  
  *redundant = false;
  *infeasible = false;
  if (vubCol != -1) {
    pHVar2 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar1 = vub->coef;
    dVar5 = vub->constant;
    dVar4 = 0.0;
    if (dVar1 <= 0.0) {
      dVar4 = dVar1;
    }
    dVar3 = dVar5 + dVar4;
    dVar3 = (dVar4 - (dVar3 - dVar5)) + (dVar5 - (dVar3 - (dVar3 - dVar5))) + 0.0 + dVar3;
    if (ub - pHVar2->feastol <= dVar3) {
      *redundant = true;
    }
    else {
      dVar4 = 0.0;
      if (0.0 <= dVar1) {
        dVar4 = dVar1;
      }
      dVar6 = dVar5 + dVar4;
      dVar6 = (dVar4 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + 0.0 + dVar6;
      if (dVar6 <= pHVar2->epsilon + ub) {
        if ((allowBoundChanges) && (dVar6 < ub - pHVar2->epsilon)) {
          boundchg._8_8_ = (ulong)(uint)col + 0x100000000;
          boundchg.boundval = dVar6;
          HighsDomain::changeBound(&pHVar2->domain,boundchg,(Reason)0xfffffffe);
          *infeasible = (((this->mipsolver->mipdata_)._M_t.
                          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                          .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain)
                        .infeasible_;
        }
      }
      else {
        dVar5 = ub - dVar3;
        dVar5 = (ub - (dVar3 + dVar5)) + (-dVar3 - (dVar5 - (dVar3 + dVar5))) + dVar5;
        if (dVar1 <= 0.0) {
          vub->constant = ub;
          dVar5 = -dVar5;
        }
        vub->coef = dVar5;
      }
    }
  }
  return;
}

Assistant:

void HighsImplications::cleanupVub(HighsInt col, HighsInt vubCol,
                                   HighsImplications::VarBound& vub, double ub,
                                   bool& redundant, bool& infeasible,
                                   bool allowBoundChanges) const {
  // initialize
  redundant = false;
  infeasible = false;

  // return if there is no variable bound
  if (vubCol == -1) return;

  // check variable upper bound
  mipsolver.mipdata_->debugSolution.checkVub(col, vubCol, vub.coef,
                                             vub.constant);

  HighsCDouble maxub = vub.maxValue();
  HighsCDouble minub = vub.minValue();

  if (minub >= ub - mipsolver.mipdata_->feastol) {
    // variable bound is redundant
    redundant = true;
  } else if (maxub > ub + mipsolver.mipdata_->epsilon) {
    // coefficient can be tightened
    double newcoef = static_cast<double>(ub - minub);
    if (vub.coef > 0) {
      vub.coef = newcoef;
    } else {
      vub.constant = ub;
      vub.coef = -newcoef;
    }
    // check tightened variable upper bound
    mipsolver.mipdata_->debugSolution.checkVub(col, vubCol, vub.coef,
                                               vub.constant);
  } else if (allowBoundChanges && maxub < ub - mipsolver.mipdata_->epsilon) {
    mipsolver.mipdata_->domain.changeBound(HighsBoundType::kUpper, col,
                                           static_cast<double>(maxub),
                                           HighsDomain::Reason::unspecified());
    infeasible = mipsolver.mipdata_->domain.infeasible();
  }
}